

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int find_stable_regions(FIRSTPASS_STATS *stats,double *grad_coded,int this_start,int this_last,
                       REGIONS *regions)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int local_74;
  int local_70;
  int local_6c;
  int is_coded_small;
  int is_coded_stable;
  int is_intra_stable;
  REGION_TYPES cur_type;
  int idx;
  int count;
  double var_coded;
  double mean_coded;
  double var_intra;
  double mean_intra;
  int k;
  int j;
  int i;
  REGIONS *regions_local;
  int this_last_local;
  int this_start_local;
  double *grad_coded_local;
  FIRSTPASS_STATS *stats_local;
  
  k = 0;
  regions->start = this_start;
  for (i = this_start; i <= this_last; i = i + 1) {
    mean_intra = 0.001;
    var_intra = 0.001;
    mean_coded = 0.001;
    var_coded = 0.001;
    count = 0;
    for (j = -3; j < 4; j = j + 1) {
      local_6c = this_start;
      if (this_start < i + j) {
        local_6c = i + j;
      }
      local_74 = this_last;
      if (local_6c < this_last) {
        local_70 = this_start;
        if (this_start < i + j) {
          local_70 = i + j;
        }
        local_74 = local_70;
      }
      if ((stats[local_74].is_flash == 0) &&
         ((local_74 < 1 || (stats[local_74 + -1].is_flash == 0)))) {
        mean_intra = stats[local_74].intra_error + mean_intra;
        var_intra = stats[local_74].intra_error * stats[local_74].intra_error + var_intra;
        mean_coded = stats[local_74].coded_error + mean_coded;
        var_coded = stats[local_74].coded_error * stats[local_74].coded_error + var_coded;
        count = count + 1;
      }
    }
    if (count < 1) {
      cur_type = HIGH_VAR_REGION;
    }
    else {
      dVar1 = mean_intra / (double)count;
      dVar2 = mean_coded / (double)count;
      if ((1.04 <= (var_coded / (double)count) / (dVar2 * dVar2)) ||
         (bVar3 = true, 0.05 <= ABS(grad_coded[i]) / dVar2)) {
        bVar3 = dVar2 / dVar1 < 0.05;
      }
      bVar4 = false;
      if (((var_intra / (double)count) / (dVar1 * dVar1) < 1.03) && (bVar4 = false, bVar3)) {
        bVar4 = dVar2 < dVar1 * 0.5;
      }
      cur_type = (REGION_TYPES)!bVar4;
    }
    if (i == regions[k].start) {
      regions[k].type = cur_type;
    }
    else if (cur_type != regions[k].type) {
      regions[k].last = i + -1;
      regions[k + 1].start = i;
      regions[k + 1].type = cur_type;
      k = k + 1;
    }
  }
  regions[k].last = this_last;
  return k + 1;
}

Assistant:

static int find_stable_regions(const FIRSTPASS_STATS *stats,
                               const double *grad_coded, int this_start,
                               int this_last, REGIONS *regions) {
  int i, j, k = 0;
  regions[k].start = this_start;
  for (i = this_start; i <= this_last; i++) {
    // Check mean and variance of stats in a window
    double mean_intra = 0.001, var_intra = 0.001;
    double mean_coded = 0.001, var_coded = 0.001;
    int count = 0;
    for (j = -HALF_WIN; j <= HALF_WIN; j++) {
      int idx = AOMMIN(AOMMAX(i + j, this_start), this_last);
      if (stats[idx].is_flash || (idx > 0 && stats[idx - 1].is_flash)) continue;
      mean_intra += stats[idx].intra_error;
      var_intra += stats[idx].intra_error * stats[idx].intra_error;
      mean_coded += stats[idx].coded_error;
      var_coded += stats[idx].coded_error * stats[idx].coded_error;
      count++;
    }

    REGION_TYPES cur_type;
    if (count > 0) {
      mean_intra /= (double)count;
      var_intra /= (double)count;
      mean_coded /= (double)count;
      var_coded /= (double)count;
      int is_intra_stable = (var_intra / (mean_intra * mean_intra) < 1.03);
      int is_coded_stable = (var_coded / (mean_coded * mean_coded) < 1.04 &&
                             fabs(grad_coded[i]) / mean_coded < 0.05) ||
                            mean_coded / mean_intra < 0.05;
      int is_coded_small = mean_coded < 0.5 * mean_intra;
      cur_type = (is_intra_stable && is_coded_stable && is_coded_small)
                     ? STABLE_REGION
                     : HIGH_VAR_REGION;
    } else {
      cur_type = HIGH_VAR_REGION;
    }

    // mark a new region if type changes
    if (i == regions[k].start) {
      // first frame in the region
      regions[k].type = cur_type;
    } else if (cur_type != regions[k].type) {
      // Append a new region
      regions[k].last = i - 1;
      regions[k + 1].start = i;
      regions[k + 1].type = cur_type;
      k++;
    }
  }
  regions[k].last = this_last;
  return k + 1;
}